

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O1

ScalarFunction * duckdb::GetBitFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_169;
  code *local_168;
  undefined8 uStack_160;
  code *local_158;
  code *pcStack_150;
  LogicalType local_148 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_130;
  LogicalType local_118 [24];
  LogicalType local_100 [24];
  LogicalType local_e8 [24];
  BaseScalarFunction local_d0 [176];
  
  duckdb::LogicalType::LogicalType(local_100,BIT);
  duckdb::LogicalType::LogicalType(local_e8,INTEGER);
  __l._M_len = 2;
  __l._M_array = local_100;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_130,__l,&local_169);
  duckdb::LogicalType::LogicalType(local_148,INTEGER);
  uStack_160 = 0;
  local_168 = ScalarFunction::BinaryFunction<duckdb::string_t,int,int,duckdb::GetBitOperator>;
  pcStack_150 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_118,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_118);
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,3);
  }
  duckdb::LogicalType::~LogicalType(local_148);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_130);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_100 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  BaseScalarFunction::SetReturnsError(local_d0,&in_RDI->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_d0);
  return in_RDI;
}

Assistant:

ScalarFunction GetBitFun::GetFunction() {
	ScalarFunction func({LogicalType::BIT, LogicalType::INTEGER}, LogicalType::INTEGER,
	                    ScalarFunction::BinaryFunction<string_t, int32_t, int32_t, GetBitOperator>);
	BaseScalarFunction::SetReturnsError(func);
	return func;
}